

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O0

void cs_debugger_func_callback(string *decl,statement_base *stmt)

{
  ulong uVar1;
  element_type *peVar2;
  size_t sVar3;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_cs::csym_info>_>
  pcVar4;
  size_t sVar5;
  size_type sVar6;
  reference pvVar7;
  ostream *poVar8;
  string *psVar9;
  statement_base *in_RSI;
  string *in_RDI;
  size_t actual_line;
  size_t current_line;
  csym_info *csym;
  key_arg<std::__cxx11::basic_string<char>_> *in_stack_ffffffffffffffb8;
  ulong uVar10;
  map_t<string,_csym_info> *this;
  key_arg<std::__cxx11::basic_string<char>_> *in_stack_ffffffffffffffc8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
  *this_00;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x12567a);
  peVar2 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x125682);
  this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
             *)&peVar2->csyms;
  cs::statement_base::get_file_path_abi_cxx11_((statement_base *)0x125695);
  sVar3 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
          ::count<std::__cxx11::string>(this_00,in_stack_ffffffffffffffc8);
  if (sVar3 == 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\nHit breakpoint, at \"");
    psVar9 = cs::statement_base::get_file_path_abi_cxx11_((statement_base *)0x1257fc);
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    poVar8 = std::operator<<(poVar8,"\", line ");
    sVar3 = cs::statement_base::get_line_num(in_RSI);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar3);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = std::operator<<(poVar8,in_RDI);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1256b8);
    peVar2 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1256c0);
    this = &peVar2->csyms;
    cs::statement_base::get_file_path_abi_cxx11_((statement_base *)0x1256d3);
    pcVar4 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
             ::
             operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>>
                       (&this->
                         super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
                        ,in_stack_ffffffffffffffb8);
    sVar5 = cs::statement_base::get_line_num(in_RSI);
    sVar3 = sVar5;
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pcVar4->map);
    if (sVar6 <= sVar3) {
      return;
    }
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&pcVar4->map,sVar5 - 1);
    uVar1 = *pvVar7;
    uVar10 = uVar1;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pcVar4->codes);
    if (sVar6 <= uVar10) {
      return;
    }
    if (uVar1 == 0) {
      return;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"\nHit breakpoint, at \"");
    poVar8 = std::operator<<(poVar8,(string *)pcVar4);
    poVar8 = std::operator<<(poVar8,"\", line ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = std::operator<<(poVar8,in_RDI);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  current_level =
       cs::stack_type<cs_impl::any,_std::allocator>::size
                 ((stack_type<cs_impl::any,_std::allocator> *)(cs::current_process + 0x80));
  exec_by_step = true;
  return;
}

Assistant:

void cs_debugger_func_callback(const std::string &decl, cs::statement_base *stmt)
{
	if (context->compiler->csyms.count(stmt->get_file_path()) > 0) {
		cs::csym_info &csym = context->compiler->csyms[stmt->get_file_path()];
		std::size_t current_line = stmt->get_line_num();
		if (current_line >= csym.map.size())
			return;
		std::size_t actual_line = csym.map[current_line - 1];
		if (actual_line >= csym.codes.size() || actual_line == 0)
			return;
		std::cout << "\nHit breakpoint, at \"" << csym.file << "\", line " << actual_line << ", " << decl << std::endl;
	}
	else
		std::cout << "\nHit breakpoint, at \"" << stmt->get_file_path() << "\", line " << stmt->get_line_num() << ", " << decl << std::endl;
	current_level = cs::current_process->stack.size();
	exec_by_step = true;
}